

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

void __thiscall
helics::ValueFederateManager::updateTime(ValueFederateManager *this,Time newTime,Time param_3)

{
  long *plVar1;
  bool bVar2;
  undefined1 uVar3;
  reference pIVar4;
  Input *pIVar5;
  undefined8 in_RSI;
  atomic_guarded<std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
  *in_RDI;
  Input *inp_1;
  Input *inp;
  bool updated;
  InputData *iData;
  BlockIterator<helics::Input,_32,_helics::Input_**> fid;
  InterfaceHandle handle;
  iterator __end1;
  iterator __begin1;
  vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *__range1;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> allCall;
  handle inpHandle;
  vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> handles;
  Input *in_stack_fffffffffffffe98;
  Input *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffffeb0;
  Input *in_stack_fffffffffffffed0;
  ValueFederateManager *in_stack_fffffffffffffed8;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_fffffffffffffee0;
  vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
  *in_stack_fffffffffffffee8;
  vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
  *in_stack_fffffffffffffef0;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_b8;
  BaseType local_9c;
  InterfaceHandle *local_98;
  __normal_iterator<helics::InterfaceHandle_*,_std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>_>
  local_90;
  undefined1 *local_88;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_50;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 local_30 [48];
  
  *(undefined8 *)&in_RDI[7].m_obj.super__Function_base._M_functor = in_RSI;
  plVar1 = *(long **)((long)&in_RDI[7].m_obj.super__Function_base._M_functor + 8);
  local_34 = *(undefined4 *)((long)&(in_RDI->m_obj).super__Function_base._M_functor + 4);
  (**(code **)(*plVar1 + 0x1a0))(plVar1,local_34);
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  bVar2 = std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::empty
                    ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)
                     in_stack_fffffffffffffeb0.internalTimeCode);
  if (bVar2) {
    local_38 = 1;
  }
  else {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            *)in_stack_fffffffffffffed8);
    gmlc::libguarded::
    atomic_guarded<std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
    ::load(in_RDI);
    local_88 = local_30;
    local_90._M_current =
         (InterfaceHandle *)
         std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::begin
                   ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)
                    in_stack_fffffffffffffe98);
    local_98 = (InterfaceHandle *)
               std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::end
                         ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
                           *)in_stack_fffffffffffffe98);
    while (bVar2 = __gnu_cxx::
                   operator==<helics::InterfaceHandle_*,_std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>_>
                             ((__normal_iterator<helics::InterfaceHandle_*,_std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>_>
                               *)in_stack_fffffffffffffea0,
                              (__normal_iterator<helics::InterfaceHandle_*,_std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>_>
                               *)in_stack_fffffffffffffe98), ((bVar2 ^ 0xffU) & 1) != 0) {
      pIVar4 = __gnu_cxx::
               __normal_iterator<helics::InterfaceHandle_*,_std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>_>
               ::operator*(&local_90);
      local_9c = pIVar4->hid;
      gmlc::libguarded::
      lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::operator->(&local_50);
      gmlc::containers::
      DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::
      find(in_stack_fffffffffffffee0,(InterfaceHandle *)in_stack_fffffffffffffed8);
      gmlc::libguarded::
      lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::operator->(&local_50);
      gmlc::containers::
      DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::end
                ((DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
                  *)in_stack_fffffffffffffea0);
      bVar2 = gmlc::containers::BlockIterator<helics::Input,32,helics::Input**>::operator!=
                        ((BlockIterator<helics::Input,_32,_helics::Input_**> *)
                         in_stack_fffffffffffffea0,
                         (BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *)
                         in_stack_fffffffffffffe98);
      if (bVar2) {
        pIVar5 = gmlc::containers::BlockIterator<helics::Input,_32,_helics::Input_**>::operator->
                           (&local_b8);
        *(undefined8 *)((long)pIVar5->dataReference + 0x28) =
             *(undefined8 *)&in_RDI[7].m_obj.super__Function_base._M_functor;
        in_stack_fffffffffffffeb0.internalTimeCode =
             (baseType)
             gmlc::containers::BlockIterator<helics::Input,_32,_helics::Input_**>::operator*
                       (&local_b8);
        uVar3 = getUpdateFromCore(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        if ((bool)uVar3) {
          bVar2 = std::function::operator_cast_to_bool
                            ((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>
                              *)0x2a16a5);
          if (bVar2) {
            in_stack_fffffffffffffea0 =
                 gmlc::containers::BlockIterator<helics::Input,_32,_helics::Input_**>::operator*
                           (&local_b8);
            gmlc::libguarded::
            lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            ::unlock((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                      *)in_stack_fffffffffffffea0);
            std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::
            operator()((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *
                       )CONCAT17(uVar3,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0,
                       in_stack_fffffffffffffeb0);
            gmlc::libguarded::
            shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            ::lock((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                    *)in_stack_fffffffffffffed8);
            gmlc::libguarded::
            lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            ::operator=((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                         *)in_stack_fffffffffffffea0,
                        (lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                         *)in_stack_fffffffffffffe98);
            gmlc::libguarded::
            lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
            ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                            *)0x2a1743);
          }
          else {
            bVar2 = std::function::operator_cast_to_bool
                              ((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>
                                *)0x2a17ad);
            if (bVar2) {
              in_stack_fffffffffffffe98 =
                   gmlc::containers::BlockIterator<helics::Input,_32,_helics::Input_**>::operator*
                             (&local_b8);
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::unlock((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                        *)in_stack_fffffffffffffea0);
              std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::
              operator()((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>
                          *)CONCAT17(uVar3,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0,
                         in_stack_fffffffffffffeb0);
              gmlc::libguarded::
              shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::lock((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                      *)in_stack_fffffffffffffed8);
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::operator=((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                           *)in_stack_fffffffffffffea0,
                          (lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                           *)in_stack_fffffffffffffe98);
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                              *)0x2a183c);
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<helics::InterfaceHandle_*,_std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>_>
      ::operator++(&local_90);
    }
    std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::~function
              ((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)
               0x2a1863);
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                    *)0x2a1870);
    local_38 = 0;
  }
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::~vector
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)
             in_stack_fffffffffffffeb0.internalTimeCode);
  return;
}

Assistant:

void ValueFederateManager::updateTime(Time newTime, Time /*oldTime*/)
{
    CurrentTime = newTime;
    auto handles = coreObject->getValueUpdates(fedID);
    if (handles.empty()) {
        return;
    }
    // lock the data updates
    auto inpHandle = inputs.lock();
    auto allCall = allCallback.load();
    for (auto handle : handles) {
        /** find the id*/
        auto fid = inpHandle->find(handle);
        if (fid != inpHandle->end()) {  // assign the data
            auto* iData = static_cast<InputData*>(fid->dataReference);
            iData->lastUpdate = CurrentTime;

            bool updated = getUpdateFromCore(*fid);

            if (updated) {
                if (iData->callback) {
                    Input& inp = *fid;

                    inpHandle.unlock();  // need to free the lock

                    // callbacks can do all sorts of things, best not to have it locked during the
                    // callback
                    iData->callback(inp, CurrentTime);
                    inpHandle = inputs.lock();
                } else if (allCall) {
                    Input& inp = *fid;
                    inpHandle.unlock();  // need to free the lock
                    // callbacks can do all sorts of strange things, best not to have it locked
                    // during the callback
                    allCall(inp, CurrentTime);
                    inpHandle = inputs.lock();
                }
            }
        }
    }
}